

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.cpp
# Opt level: O0

uint8_t * __thiscall
cdns_query::parse(cdns_query *this,uint8_t *in,uint8_t *in_max,int *err,cdnsBlock *current_block)

{
  bool bVar1;
  uint8_t *puVar2;
  int64_t iVar3;
  cdnsBlock *current_block_local;
  int *err_local;
  uint8_t *in_max_local;
  uint8_t *in_local;
  cdns_query *this_local;
  
  this->current_block = current_block;
  puVar2 = cbor_map_parse<cdns_query>(in,in_max,this,err);
  bVar1 = cdns::is_old_version(current_block->current_cdns);
  if (!bVar1) {
    iVar3 = cdns::ticks_to_microseconds
                      (current_block->current_cdns,(long)this->time_offset_usec,
                       (current_block->preamble).block_parameter_index);
    this->time_offset_usec = (int)iVar3;
  }
  return puVar2;
}

Assistant:

uint8_t* cdns_query::parse(uint8_t* in, uint8_t const* in_max, int* err, cdnsBlock* current_block)
{
    this->current_block = current_block;
    in = cbor_map_parse(in, in_max, this, err);
    if (!current_block->current_cdns->is_old_version()) {
        time_offset_usec = (int)current_block->current_cdns->ticks_to_microseconds(time_offset_usec, 
            current_block->preamble.block_parameter_index);
    }
    return in;
}